

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmListFileBacktrace local_40;
  
  this->Makefile = mf;
  this->ReportError = true;
  cmListFileBacktrace::Push(&local_40,&mf->Backtrace,filenametoread);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_40);
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  cmState::CreateInlineListFileSnapshot
            (&local_40.Bottom,this->Makefile->GlobalGenerator->CMakeInstance->State,
             &this->Makefile->StateSnapshot,filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_40.Bottom.Position.Position;
  (pcVar1->StateSnapshot).State = local_40.Bottom.State;
  (pcVar1->StateSnapshot).Position.Tree = local_40.Bottom.Position.Tree;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar2) {
    PushFunctionBlockerBarrier(this->Makefile);
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                ,0x1e9,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf)
    , ReportError(true)
  {
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateInlineListFileSnapshot(
        this->Makefile->StateSnapshot, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }